

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O2

bool __thiscall uv::TCPClient::SetKeepAlive(TCPClient *this,int enable,uint delay)

{
  char *pcVar1;
  int errcode;
  CStringStream *pCVar2;
  ILog4zManager *pIVar3;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  long *in_FS_OFFSET;
  string local_60;
  CStringStream ss;
  
  errcode = uv_tcp_keepalive(this->client_handle_,CONCAT44(in_register_00000034,enable),
                             CONCAT44(in_register_00000014,delay));
  if (errcode != 0) {
    GetUVError_abi_cxx11_((string *)&ss,errcode);
    std::__cxx11::string::operator=((string *)&this->errmsg_,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    ss.m_pEnd = (char *)*in_FS_OFFSET;
    pcVar1 = ss.m_pEnd + -0x800;
    ss.m_pBegin = pcVar1;
    ss.m_pCur = pcVar1;
    std::__cxx11::string::string((string *)&local_60,(string *)&this->errmsg_);
    zsummer::log4z::CStringStream::operator<<(&ss,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar2,0xa1);
    pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar3->_vptr_ILog4zManager[8])(pIVar3,0,3,pcVar1);
  }
  return errcode == 0;
}

Assistant:

bool TCPClient::SetKeepAlive(int enable, unsigned int delay)
{
    int iret = uv_tcp_keepalive(&client_handle_->tcphandle, enable , delay);
    if (iret) {
        errmsg_ = GetUVError(iret);
        LOGE(errmsg_);
        return false;
    }
    return true;
}